

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_PiecewiseLinearExprPrecedence_Test::TestBody
          (ExprWriterTest_PiecewiseLinearExprPrecedence_Test *this)

{
  int iVar1;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> lhs;
  Reference RVar2;
  ExprBase rhs;
  ExprFactory *this_00;
  char *message;
  Impl *impl;
  PLTermBuilder PVar3;
  AssertHelper local_48;
  AssertionResult gtest_ar;
  string local_30;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory;
  PVar3 = mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm(this_00,2);
  lhs.super_ExprBase.impl_ = (ExprBase)PVar3.impl_;
  iVar1 = PVar3.slope_index_;
  *(undefined8 *)((long)lhs.super_ExprBase.impl_ + 0x10 + (long)(iVar1 * 2) * 8) =
       0xbff0000000000000;
  *(undefined8 *)
   ((long)lhs.super_ExprBase.impl_ + 0x10 + ((long)(int)(PVar3._8_8_ >> 0x1f) << 3 | 8U)) =
       0x4014000000000000;
  *(undefined8 *)((long)lhs.super_ExprBase.impl_ + 0x10 + (long)(iVar1 * 2 + 2) * 8) = 0;
  *(undefined8 *)
   ((long)lhs.super_ExprBase.impl_ + 0x10 +
   ((long)((PVar3._8_8_ & 0xffffffff00000000) * 2 + 0x300000000) >> 0x1d)) = 0x4024000000000000;
  *(undefined8 *)((long)lhs.super_ExprBase.impl_ + 0x10 + (long)(iVar1 * 2 + 4) * 8) =
       0x3ff0000000000000;
  RVar2 = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,0x2a);
  ((BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> *)((long)lhs.super_ExprBase.impl_ + 8))->
  super_ExprBase =
       (ExprBase)RVar2.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  rhs.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,2.0);
  local_48.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,POW,lhs,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)rhs.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_30,(fmt *)0x14e4d3,(CStringRef)&local_48,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)rhs.impl_);
  testing::internal::CmpHelperEQ<char[28],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"<<5, 10; -1, 0, 1>> x43 ^ 2\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeBinary(ex::POW, EndPLTerm(plterm, MakeVariable(42)), MakeConst(2))))"
             ,(char (*) [28])"<<5, 10; -1, 0, 1>> x43 ^ 2",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x222,message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprWriterTest, PiecewiseLinearExprPrecedence) {
  auto plterm = BeginPLTerm(2);
  plterm.AddSlope(-1);
  plterm.AddBreakpoint(5);
  plterm.AddSlope(0);
  plterm.AddBreakpoint(10);
  plterm.AddSlope(1);
  CHECK_WRITE("<<5, 10; -1, 0, 1>> x43 ^ 2",
      MakeBinary(ex::POW, EndPLTerm(plterm, MakeVariable(42)), MakeConst(2)));
}